

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

float __thiscall deqp::gls::GLValue::toFloat(GLValue *this)

{
  char cVar1;
  byte bVar2;
  short sVar3;
  unsigned_short uVar4;
  deInt32 dVar5;
  uint uVar6;
  int iVar7;
  double dVar8;
  int maxValue;
  GLValue *this_local;
  
  switch(this->type) {
  case INPUTTYPE_FLOAT:
    this_local._4_4_ = WrappedFloatType<float>::getValue(&(this->field_1).fl);
    break;
  case INPUTTYPE_FIXED:
    dVar5 = Fixed::getValue(&(this->field_1).fi);
    this_local._4_4_ = (float)(dVar5 * 2 + 1) / 65535.0;
    break;
  case INPUTTYPE_DOUBLE:
    dVar8 = WrappedFloatType<double>::getValue((WrappedFloatType<double> *)&(this->field_1).fl);
    this_local._4_4_ = (float)dVar8;
    break;
  case INPUTTYPE_BYTE:
    cVar1 = WrappedType<signed_char>::getValue((WrappedType<signed_char> *)&(this->field_1).fl);
    this_local._4_4_ = (float)(int)cVar1;
    break;
  case INPUTTYPE_SHORT:
    sVar3 = WrappedType<short>::getValue((WrappedType<short> *)&(this->field_1).fl);
    this_local._4_4_ = (float)(int)sVar3;
    break;
  case INPUTTYPE_UNSIGNED_BYTE:
    bVar2 = WrappedType<unsigned_char>::getValue((WrappedType<unsigned_char> *)&(this->field_1).fl);
    this_local._4_4_ = (float)bVar2;
    break;
  case INPUTTYPE_UNSIGNED_SHORT:
    uVar4 = WrappedType<unsigned_short>::getValue
                      ((WrappedType<unsigned_short> *)&(this->field_1).fl);
    this_local._4_4_ = (float)uVar4;
    break;
  case INPUTTYPE_INT:
    iVar7 = WrappedType<int>::getValue((WrappedType<int> *)&(this->field_1).fl);
    this_local._4_4_ = (float)iVar7;
    break;
  case INPUTTYPE_UNSIGNED_INT:
    uVar6 = WrappedType<unsigned_int>::getValue((WrappedType<unsigned_int> *)&(this->field_1).fl);
    this_local._4_4_ = (float)uVar6;
    break;
  case INPUTTYPE_HALF:
    this_local._4_4_ = Half::to<float>(&(this->field_1).h);
    break;
  default:
    this_local._4_4_ = 0.0;
  }
  return this_local._4_4_;
}

Assistant:

float GLValue::toFloat (void) const
{
	switch (type)
	{
		case Array::INPUTTYPE_FLOAT:
			return fl.getValue();
			break;

		case Array::INPUTTYPE_BYTE:
			return b.getValue();
			break;

		case Array::INPUTTYPE_UNSIGNED_BYTE:
			return ub.getValue();
			break;

		case Array::INPUTTYPE_SHORT:
			return s.getValue();
			break;

		case Array::INPUTTYPE_UNSIGNED_SHORT:
			return us.getValue();
			break;

		case Array::INPUTTYPE_FIXED:
		{
			int maxValue = 65536;
			return (float)(double(2 * fi.getValue() + 1) / (maxValue - 1));

			break;
		}

		case Array::INPUTTYPE_UNSIGNED_INT:
			return (float)ui.getValue();
			break;

		case Array::INPUTTYPE_INT:
			return (float)i.getValue();
			break;

		case Array::INPUTTYPE_HALF:
			return h.to<float>();
			break;

		case Array::INPUTTYPE_DOUBLE:
			return (float)d.getValue();
			break;

		default:
			DE_ASSERT(false);
			return 0.0f;
			break;
	};
}